

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateWrapperFieldGetterDocComment
               (Printer *printer,FieldDescriptor *field)

{
  string *name;
  FieldDescriptor *in_RSI;
  FieldDescriptor *in_RDI;
  FieldDescriptor *primitiveField;
  FieldDescriptor *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffee0;
  Descriptor *in_stack_fffffffffffffee8;
  string *input;
  string local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  Printer *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  Printer *in_stack_ffffffffffffff30;
  FieldDescriptor *in_stack_ffffffffffffff48;
  Printer *in_stack_ffffffffffffff50;
  string local_90 [7];
  undefined1 in_stack_ffffffffffffff77;
  FieldDescriptor *in_stack_ffffffffffffff78;
  string local_70 [55];
  undefined1 local_39 [33];
  string *local_18;
  FieldDescriptor *local_10;
  FieldDescriptor *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  FieldDescriptor::message_type(in_stack_fffffffffffffed0);
  input = (string *)local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_39 + 1),"value",(allocator *)input);
  name = (string *)Descriptor::FindFieldByName(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  local_18 = name;
  io::Printer::Print<>(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  FieldDescriptor::name_abi_cxx11_(local_10);
  UnderscoresToCamelCase(name,SUB81((ulong)local_70 >> 0x38,0));
  io::Printer::Print<char[11],std::__cxx11::string>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             &in_stack_ffffffffffffff20->variable_delimiter_,in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(local_70);
  GenerateDocCommentBody<google::protobuf::FieldDescriptor>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  FieldDescriptor::DebugString_abi_cxx11_(local_8);
  FirstLineOf(name);
  EscapePhpdoc(input);
  io::Printer::Print<char[4],std::__cxx11::string>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             &in_stack_ffffffffffffff20->variable_delimiter_,in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  PhpGetterTypeName_abi_cxx11_(in_stack_ffffffffffffff78,(bool)in_stack_ffffffffffffff77);
  io::Printer::Print<char[9],std::__cxx11::string>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             &in_stack_ffffffffffffff20->variable_delimiter_,in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(local_f0);
  io::Printer::Print<>(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  return;
}

Assistant:

void GenerateWrapperFieldGetterDocComment(io::Printer* printer, const FieldDescriptor* field) {
  // Generate a doc comment for the special getXXXValue methods that are
  // generated for wrapper types.
  const FieldDescriptor* primitiveField = field->message_type()->FindFieldByName("value");
  printer->Print("/**\n");
  printer->Print(
      " * Returns the unboxed value from <code>get^camel_name^()</code>\n\n",
      "camel_name", UnderscoresToCamelCase(field->name(), true));
  GenerateDocCommentBody(printer, field);
  printer->Print(
    " * Generated from protobuf field <code>^def^</code>\n",
    "def", EscapePhpdoc(FirstLineOf(field->DebugString())));
  printer->Print(" * @return ^php_type^|null\n",
        "php_type", PhpGetterTypeName(primitiveField, false));
  printer->Print(" */\n");
}